

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.hh
# Opt level: O2

void __thiscall
kratos::PortBundleRef::PortBundleRef
          (PortBundleRef *this,Generator *generator,PortBundleDefinition *def)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_PackedInterface)._vptr_PackedInterface =
       (_func_int **)&PTR_member_names_abi_cxx11__002afe98;
  this->generator = generator;
  PortBundleDefinition::PortBundleDefinition(&this->definition_,def);
  p_Var1 = &(this->name_mappings_)._M_t._M_impl.super__Rb_tree_header;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->name_mappings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

PortBundleRef(Generator *generator, PortBundleDefinition def)
        : generator(generator), definition_(std::move(def)) {}